

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

int __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::shutdown
          (reactive_socket_service<asio::ip::tcp> *this,int __fd,int __how)

{
  int iVar1;
  int *piVar2;
  error_code *in_RCX;
  undefined4 in_register_00000034;
  
  if (*(int *)CONCAT44(in_register_00000034,__fd) == -1) {
    std::error_code::operator=(in_RCX,bad_descriptor);
    iVar1 = in_RCX->_M_value;
  }
  else {
    iVar1 = ::shutdown(*(int *)CONCAT44(in_register_00000034,__fd),__how);
    if (iVar1 == 0) {
      in_RCX->_M_value = 0;
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (system_category()::instance == '\0') {
        shutdown();
      }
      in_RCX->_M_value = iVar1;
      in_RCX->_M_cat = (error_category *)&system_category()::instance;
    }
  }
  return iVar1;
}

Assistant:

asio::error_code shutdown(base_implementation_type& impl,
      socket_base::shutdown_type what, asio::error_code& ec)
  {
    socket_ops::shutdown(impl.socket_, what, ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }